

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

int libssh2_channel_wait_closed(LIBSSH2_CHANNEL *channel)

{
  LIBSSH2_SESSION *session;
  int iVar1;
  time_t start_time;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  start_time = time((time_t *)0x0);
  do {
    session = channel->session;
    iVar1 = libssh2_channel_eof(channel);
    if (iVar1 == 0) {
      iVar1 = _libssh2_error(session,-0x22,
                             "libssh2_channel_wait_closed() invoked when channel is not in EOF state"
                            );
    }
    else {
      if (channel->wait_closed_state == libssh2_NB_state_idle) {
        channel->wait_closed_state = libssh2_NB_state_created;
      }
      if ((channel->remote).close != '\0') {
LAB_00116f2b:
        channel->wait_closed_state = libssh2_NB_state_idle;
        return 0;
      }
      do {
        iVar1 = _libssh2_transport_read(session);
        if ((channel->remote).close != '\0') break;
      } while (0 < iVar1);
      if (-1 < iVar1) goto LAB_00116f2b;
    }
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (channel->session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(channel->session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

static int channel_wait_closed(LIBSSH2_CHANNEL *channel)
{
    LIBSSH2_SESSION *session = channel->session;
    int rc;

    if (!libssh2_channel_eof(channel)) {
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "libssh2_channel_wait_closed() invoked when "
                              "channel is not in EOF state");
    }

    if (channel->wait_closed_state == libssh2_NB_state_idle) {
        _libssh2_debug(session, LIBSSH2_TRACE_CONN,
                       "Awaiting close of channel %lu/%lu", channel->local.id,
                       channel->remote.id);

        channel->wait_closed_state = libssh2_NB_state_created;
    }

    /*
     * While channel is not closed, read more packets from the network.
     * Either the channel will be closed or network timeout will occur.
     */
    if (!channel->remote.close) {
        do {
            rc = _libssh2_transport_read(session);
            if (channel->remote.close)
                /* it is now closed, move on! */
                break;
        } while (rc > 0);
        if(rc < 0)
            return rc;
    }

    channel->wait_closed_state = libssh2_NB_state_idle;

    return 0;
}